

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O0

uint64_t helper_fcmpne32(uint64_t src1,uint64_t src2)

{
  uint uVar1;
  undefined8 local_28;
  VIS64 d;
  VIS64 s;
  uint64_t src2_local;
  uint64_t src1_local;
  
  d.l[0] = (uint32_t)src1;
  local_28._0_4_ = (uint32_t)src2;
  local_28._4_4_ = (uint32_t)(src2 >> 0x20);
  d.l[1] = (uint32_t)(src1 >> 0x20);
  uVar1 = 0;
  if (d.l[1] != local_28._4_4_) {
    uVar1 = 2;
  }
  local_28 = (ulong)(uVar1 | d.l[0] != (uint32_t)local_28);
  return local_28;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}